

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeMSRMask(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint Mask;
  uint ValLow;
  uint64_t FeatureBits;
  void *Decoder_local;
  uint64_t Address_local;
  uint Val_local;
  MCInst *Inst_local;
  
  uVar3 = ARM_getFeatureBits(Inst->csh->mode);
  if ((uVar3 & 0x10000) == 0) {
    if (Val == 0) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar1 = Val & 0xff;
    if (((3 < uVar1) && (4 < uVar1 - 5)) && (uVar1 != 0x10)) {
      if (uVar1 - 0x11 < 3) {
        if ((uVar3 & 0x40000000000) == 0) {
          return MCDisassembler_Fail;
        }
      }
      else if (uVar1 != 0x14) {
        return MCDisassembler_Fail;
      }
    }
    if ((((uVar3 & 0x40000000000) != 0) && (uVar2 = MCInst_getOpcode(Inst), uVar2 == 0x99c)) &&
       (((uVar2 = Val >> 10 & 3, uVar2 == 0 || ((uVar2 != 2 && (3 < uVar1)))) ||
        (((uVar3 & 0x200) == 0 && (uVar2 == 1)))))) {
      return MCDisassembler_Fail;
    }
  }
  MCOperand_CreateImm0(Inst,(ulong)Val);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMSRMask(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	uint64_t FeatureBits = ARM_getFeatureBits(Inst->csh->mode);
	if (FeatureBits & ARM_FeatureMClass) {
		unsigned ValLow = Val & 0xff;

		// Validate the SYSm value first.
		switch (ValLow) {
			case  0: // apsr
			case  1: // iapsr
			case  2: // eapsr
			case  3: // xpsr
			case  5: // ipsr
			case  6: // epsr
			case  7: // iepsr
			case  8: // msp
			case  9: // psp
			case 16: // primask
			case 20: // control
				break;
			case 17: // basepri
			case 18: // basepri_max
			case 19: // faultmask
				if (!(FeatureBits & ARM_HasV7Ops))
					// Values basepri, basepri_max and faultmask are only valid for v7m.
					return MCDisassembler_Fail;
				break;
			default:
				return MCDisassembler_Fail;
		}

		// The ARMv7-M architecture has an additional 2-bit mask value in the MSR
		// instruction (bits {11,10}). The mask is used only with apsr, iapsr,
		// eapsr and xpsr, it has to be 0b10 in other cases. Bit mask{1} indicates
		// if the NZCVQ bits should be moved by the instruction. Bit mask{0}
		// indicates the move for the GE{3:0} bits, the mask{0} bit can be set
		// only if the processor includes the DSP extension.
		if ((FeatureBits & ARM_HasV7Ops) && MCInst_getOpcode(Inst) == ARM_t2MSR_M) {
			unsigned Mask = (Val >> 10) & 3;
			if (Mask == 0 || (Mask != 2 && ValLow > 3) ||
					(!(FeatureBits & ARM_FeatureDSPThumb2) && Mask == 1))
				return MCDisassembler_Fail;
		}
	} else {
		// A/R class
		if (Val == 0)
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, Val);
	return MCDisassembler_Success;
}